

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O2

SchnorrSignature *
cfd::core::SignCommon
          (SchnorrSignature *__return_storage_ptr__,ByteData256 *msg,Privkey *sk,
          secp256k1_nonce_function_hardened *nonce_fn,ByteData *ndata)

{
  bool bVar1;
  int iVar2;
  secp256k1_context_struct *ctx;
  CfdException *pCVar3;
  secp256k1_nonce_function_hardened noncefp;
  allocator local_e9;
  string local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw_sig;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  secp256k1_keypair keypair;
  
  ctx = wally_get_secp_context();
  Privkey::GetData((ByteData *)&raw_sig,sk);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,
                     (ByteData *)&raw_sig);
  iVar2 = secp256k1_keypair_create(ctx,&keypair,(uchar *)local_e8._M_dataplus._M_p);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&raw_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (iVar2 != 1) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&local_e8,"Could not create keypair.",(allocator *)&raw_sig);
    CfdException::CfdException(pCVar3,kCfdInternalError,&local_e8);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (nonce_fn == (secp256k1_nonce_function_hardened *)0x0) {
    noncefp = (secp256k1_nonce_function_hardened)0x0;
  }
  else {
    noncefp = *nonce_fn;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&raw_sig,0x40,(allocator_type *)&local_e8);
  ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,msg);
  bVar1 = ByteData::IsEmpty(ndata);
  if (bVar1) {
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,ndata);
  }
  iVar2 = secp256k1_schnorrsig_sign
                    (ctx,raw_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,(uchar *)local_e8._M_dataplus._M_p
                     ,&keypair,noncefp,local_a8._M_impl.super__Vector_impl_data._M_start);
  if (!bVar1) {
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8);
  if (iVar2 == 1) {
    ByteData::ByteData((ByteData *)&local_e8,&raw_sig);
    SchnorrSignature::SchnorrSignature(__return_storage_ptr__,(ByteData *)&local_e8);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&raw_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_e8,"Could not create Schnorr signature.",&local_e9);
  CfdException::CfdException(pCVar3,kCfdInternalError,&local_e8);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

SchnorrSignature SignCommon(
    const ByteData256 &msg, const Privkey &sk,
    const secp256k1_nonce_function_hardened *nonce_fn, const ByteData ndata) {
  auto ctx = wally_get_secp_context();
  secp256k1_keypair keypair;
  auto ret =
      secp256k1_keypair_create(ctx, &keypair, sk.GetData().GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create keypair.");
  }

  secp256k1_nonce_function_hardened nfn =
      nonce_fn == nullptr ? nullptr : *nonce_fn;

  std::vector<uint8_t> raw_sig(SchnorrSignature::kSchnorrSignatureSize);

  ret = secp256k1_schnorrsig_sign(
      ctx, raw_sig.data(), msg.GetBytes().data(), &keypair, nfn,
      (ndata.IsEmpty()) ? nullptr : ndata.GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create Schnorr signature.");
  }

  return SchnorrSignature(raw_sig);
}